

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sse2.c
# Opt level: O1

void SetResidualCoeffs_SSE2(int16_t *coeffs,VP8Residual *res)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5 = packsswb(*(undefined1 (*) [16])coeffs,*(undefined1 (*) [16])(coeffs + 8));
  auVar6[0] = -(auVar5[0] == '\0');
  auVar6[1] = -(auVar5[1] == '\0');
  auVar6[2] = -(auVar5[2] == '\0');
  auVar6[3] = -(auVar5[3] == '\0');
  auVar6[4] = -(auVar5[4] == '\0');
  auVar6[5] = -(auVar5[5] == '\0');
  auVar6[6] = -(auVar5[6] == '\0');
  auVar6[7] = -(auVar5[7] == '\0');
  auVar6[8] = -(auVar5[8] == '\0');
  auVar6[9] = -(auVar5[9] == '\0');
  auVar6[10] = -(auVar5[10] == '\0');
  auVar6[0xb] = -(auVar5[0xb] == '\0');
  auVar6[0xc] = -(auVar5[0xc] == '\0');
  auVar6[0xd] = -(auVar5[0xd] == '\0');
  auVar6[0xe] = -(auVar5[0xe] == '\0');
  auVar6[0xf] = -(auVar5[0xf] == '\0');
  uVar2 = (uint)(ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar6[0xf] >> 7) << 0xf);
  uVar4 = uVar2 ^ 0xffff;
  iVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  iVar3 = -1;
  if (uVar2 != 0xffff) {
    iVar3 = iVar1;
  }
  res->last = iVar3;
  res->coeffs = coeffs;
  return;
}

Assistant:

static void SetResidualCoeffs_SSE2(const int16_t* WEBP_RESTRICT const coeffs,
                                   VP8Residual* WEBP_RESTRICT const res) {
  const __m128i c0 = _mm_loadu_si128((const __m128i*)(coeffs + 0));
  const __m128i c1 = _mm_loadu_si128((const __m128i*)(coeffs + 8));
  // Use SSE2 to compare 16 values with a single instruction.
  const __m128i zero = _mm_setzero_si128();
  const __m128i m0 = _mm_packs_epi16(c0, c1);
  const __m128i m1 = _mm_cmpeq_epi8(m0, zero);
  // Get the comparison results as a bitmask into 16bits. Negate the mask to get
  // the position of entries that are not equal to zero. We don't need to mask
  // out least significant bits according to res->first, since coeffs[0] is 0
  // if res->first > 0.
  const uint32_t mask = 0x0000ffffu ^ (uint32_t)_mm_movemask_epi8(m1);
  // The position of the most significant non-zero bit indicates the position of
  // the last non-zero value.
  assert(res->first == 0 || coeffs[0] == 0);
  res->last = mask ? BitsLog2Floor(mask) : -1;
  res->coeffs = coeffs;
}